

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O1

Promise<void> __thiscall
kj::anon_unknown_0::makeChain2(anon_unknown_0 *this,uint i,Promise<void> *promise)

{
  Disposer *pDVar1;
  PromiseNode *pPVar2;
  TransformPromiseNodeBase *this_00;
  ChainPromiseNode *extraout_RDX;
  ChainPromiseNode *extraout_RDX_00;
  Own<kj::_::ChainPromiseNode> OVar3;
  Promise<void> PVar4;
  Own<kj::_::PromiseNode> local_58;
  Own<kj::_::PromiseNode> local_48;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  pDVar1 = (promise->super_PromiseBase).node.disposer;
  if (i == 0) {
    *(Disposer **)this = pDVar1;
    *(PromiseNode **)(this + 8) = (promise->super_PromiseBase).node.ptr;
    (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
  }
  else {
    pPVar2 = (promise->super_PromiseBase).node.ptr;
    (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
    _::yield();
    this_00 = (TransformPromiseNodeBase *)operator_new(0x40);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_58,
               CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:265:41),_kj::Promise<void>_>
               ::operator()<>);
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00451a78;
    *(uint *)&this_00[1].super_PromiseNode._vptr_PromiseNode = i;
    this_00[1].dependency.disposer = pDVar1;
    this_00[1].dependency.ptr = pPVar2;
    local_48.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::CaptureByMove<kj::(anonymous_namespace)::makeChain2(unsigned_int,kj::Promise<void>)::$_0,kj::Promise<void>>,kj::_::PropagateException>>
          ::instance;
    local_48.ptr = (PromiseNode *)this_00;
    OVar3 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_38,&local_48);
    pPVar2 = local_48.ptr;
    promise = (Promise<void> *)OVar3.ptr;
    *(undefined4 *)this = local_38;
    *(undefined4 *)(this + 4) = uStack_34;
    *(undefined4 *)(this + 8) = uStack_30;
    *(undefined4 *)(this + 0xc) = uStack_2c;
    if ((TransformPromiseNodeBase *)local_48.ptr != (TransformPromiseNodeBase *)0x0) {
      local_48.ptr = (PromiseNode *)0x0;
      (**(local_48.disposer)->_vptr_Disposer)
                (local_48.disposer,
                 ((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode);
      promise = (Promise<void> *)extraout_RDX;
    }
    pPVar2 = local_58.ptr;
    if (local_58.ptr != (PromiseNode *)0x0) {
      local_58.ptr = (PromiseNode *)0x0;
      (**(local_58.disposer)->_vptr_Disposer)
                (local_58.disposer,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode)
      ;
      promise = (Promise<void> *)extraout_RDX_00;
    }
  }
  PVar4.super_PromiseBase.node.ptr = (PromiseNode *)promise;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar4.super_PromiseBase.node;
}

Assistant:

Promise<void> makeChain2(uint i, Promise<void> promise) {
  if (i > 0) {
    return evalLater(mvCapture(promise, [i](Promise<void>&& promise) -> Promise<void> {
      return makeChain2(i - 1, kj::mv(promise));
    }));
  } else {
    return kj::mv(promise);
  }
}